

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O0

int GetCode(gdIOCtx *fd,CODE_STATIC_DATA *scd,int code_size,int flag,int *ZeroDataBlockP)

{
  int iVar1;
  int rv;
  int *ZeroDataBlockP_local;
  int flag_local;
  int code_size_local;
  CODE_STATIC_DATA *scd_local;
  gdIOCtx *fd_local;
  
  iVar1 = GetCode_(fd,scd,code_size,flag,ZeroDataBlockP);
  return iVar1;
}

Assistant:

static int
GetCode(gdIOCtx *fd, CODE_STATIC_DATA *scd, int code_size, int flag, int *ZeroDataBlockP)
{
	int rv;

	rv = GetCode_(fd, scd, code_size,flag, ZeroDataBlockP);

	if(VERBOSE) {
		printf("[GetCode(,%d,%d) returning %d]\n",code_size,flag,rv);
	}

	return rv;
}